

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O0

void get_msurf_descriptor_simd(integral_image *iimage,interest_point *ipoint)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  __m256i scale_00;
  __m256i scale_01;
  __m256i scale_02;
  __m256i col;
  __m256i col_00;
  __m256i col_01;
  __m256i row;
  __m256i row_00;
  __m256i row_01;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  float *in_RSI;
  int *in_RDI;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  int i_1;
  float norm_factor;
  float d4;
  float d3;
  float d2;
  float d1;
  float gauss_s2;
  float rry;
  float rrx;
  float ry;
  float rx;
  float gauss_s1;
  float gauss_s1_x;
  int k_1;
  int gauss_index_k;
  float gauss_s1_y;
  int l_2;
  int gauss_index_l_inc;
  int gauss_index_l;
  float mdy;
  float mdx;
  float dy;
  float dx;
  float *j_arr;
  int j;
  int gauss_index_k_inc;
  int gauss_index_k_start;
  float *i_arr;
  int i;
  float e_c1_p4;
  float e_c1_p3;
  float e_c1_p2;
  float e_c1_p1;
  float e_c1_m1;
  float e_c1_m2;
  float e_c1_m3;
  float e_c1_m4;
  float e_c0_p4;
  float e_c0_p3;
  float e_c0_p2;
  float e_c0_p1;
  float e_c0_m1;
  float e_c0_m2;
  float e_c0_m3;
  float e_c0_m4;
  float s11;
  float s10;
  float s9;
  float s8;
  float s7;
  float s6;
  float s5;
  float s4;
  float s3;
  float s2;
  float s1;
  float s0;
  __m256i sample_col2;
  __m256i sample_col1;
  __m256i sample_col0;
  __m256 ipoint_x_sub_int_scale_add_05_vec;
  __m256 kks2;
  __m256 kks1;
  __m256 kks0;
  __m256i sample_y_sub_int_scale_vec;
  int sample_y_sub_int_scale_1;
  int l_count_1;
  int l_1;
  int sample_x_sub_int_scale;
  float ipoint_x_sub_int_scale_add_k_mul_scale;
  int k_count;
  int k;
  int sample_y_sub_int_scale;
  float ipoint_y_sub_int_scale_add_l_mul_scale;
  int l_count;
  int l;
  int gauss_s2_index;
  float sum_of_squares;
  int desc_idx;
  float *descriptor;
  int height;
  int width;
  float ipoint_y_sub_int_scale_add_05;
  float ipoint_x_sub_int_scale_add_05;
  float ipoint_y_sub_int_scale;
  float ipoint_x_sub_int_scale;
  float ipoint_y;
  float ipoint_x;
  float g1_factor;
  float scale_squared;
  __m256 scale_vec;
  __m256i int_scale_vec;
  int int_scale;
  float scale;
  double local_640;
  double local_628;
  int local_614;
  undefined4 in_stack_fffffffffffff9f8;
  undefined4 in_stack_fffffffffffff9fc;
  undefined4 in_stack_fffffffffffffa00;
  undefined4 in_stack_fffffffffffffa04;
  int in_stack_fffffffffffffa0c;
  int in_stack_fffffffffffffa10;
  int in_stack_fffffffffffffa14;
  undefined4 in_stack_fffffffffffffa18;
  undefined4 in_stack_fffffffffffffa1c;
  int local_5e0;
  int local_5dc;
  int local_5d4;
  int local_5cc;
  float local_5c8;
  float local_5c4;
  float local_5c0;
  float local_5bc;
  float *local_5b8;
  int local_5ac;
  float *local_5a0;
  int local_594;
  int local_400;
  int local_3f0;
  int local_3e0;
  int local_3dc;
  float local_3d8;
  int local_3d4;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  float *haarY;
  float *haarX;
  undefined4 uVar83;
  undefined4 uVar84;
  undefined4 uVar85;
  undefined4 uVar86;
  undefined4 uVar87;
  undefined4 uVar88;
  undefined4 uVar89;
  undefined4 uVar90;
  undefined4 uVar91;
  undefined4 uVar92;
  undefined4 uVar93;
  undefined4 uVar94;
  undefined4 uStack_148;
  undefined4 uStack_144;
  integral_image *iimage_00;
  undefined8 uStack_e8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  fVar32 = in_RSI[2];
  auVar20._8_4_ = 0x80000000;
  auVar20._0_8_ = 0x8000000080000000;
  auVar20._12_4_ = 0x80000000;
  auVar17._8_4_ = 0x3effffff;
  auVar17._0_8_ = 0x3effffff3effffff;
  auVar17._12_4_ = 0x3effffff;
  auVar17 = vpternlogd_avx512vl(auVar17,ZEXT416((uint)fVar32),auVar20,0xf8);
  auVar17 = vroundss_avx(ZEXT416((uint)fVar32),ZEXT416((uint)(fVar32 + auVar17._0_4_)),0xb);
  uVar12 = (uint)auVar17._0_4_;
  auVar17 = vpinsrd_avx(ZEXT416(uVar12),uVar12,1);
  auVar17 = vpinsrd_avx(auVar17,uVar12,2);
  vpinsrd_avx(auVar17,uVar12,3);
  auVar17 = vpinsrd_avx(ZEXT416(uVar12),uVar12,1);
  auVar17 = vpinsrd_avx(auVar17,uVar12,2);
  vpinsrd_avx(auVar17,uVar12,3);
  auVar17 = vinsertps_avx(ZEXT416((uint)fVar32),ZEXT416((uint)fVar32),0x10);
  auVar17 = vinsertps_avx(auVar17,ZEXT416((uint)fVar32),0x20);
  auVar17 = vinsertps_avx(auVar17,ZEXT416((uint)fVar32),0x30);
  auVar20 = vinsertps_avx(ZEXT416((uint)fVar32),ZEXT416((uint)fVar32),0x10);
  auVar20 = vinsertps_avx(auVar20,ZEXT416((uint)fVar32),0x20);
  auVar20 = vinsertps_avx(auVar20,ZEXT416((uint)fVar32),0x30);
  iimage_00 = auVar20._0_8_;
  fVar27 = -0.08 / (fVar32 * fVar32);
  fVar1 = *in_RSI;
  auVar26._8_4_ = 0x80000000;
  auVar26._0_8_ = 0x8000000080000000;
  auVar26._12_4_ = 0x80000000;
  auVar21._8_4_ = 0x3effffff;
  auVar21._0_8_ = 0x3effffff3effffff;
  auVar21._12_4_ = 0x3effffff;
  auVar18 = vpternlogd_avx512vl(auVar21,ZEXT416((uint)fVar1),auVar26,0xf8);
  auVar18 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)(fVar1 + auVar18._0_4_)),0xb);
  auVar24._0_8_ = (double)auVar18._0_4_;
  auVar24._8_8_ = 0;
  auVar18._0_8_ = (double)fVar32;
  auVar18._8_8_ = 0;
  auVar18 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar18,auVar24);
  fVar28 = (float)auVar18._0_8_;
  fVar1 = in_RSI[1];
  auVar66._8_4_ = 0x80000000;
  auVar66._0_8_ = 0x8000000080000000;
  auVar66._12_4_ = 0x80000000;
  auVar22._8_4_ = 0x3effffff;
  auVar22._0_8_ = 0x3effffff3effffff;
  auVar22._12_4_ = 0x3effffff;
  auVar18 = vpternlogd_avx512vl(auVar22,ZEXT416((uint)fVar1),auVar66,0xf8);
  auVar18 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)(fVar1 + auVar18._0_4_)),0xb);
  auVar25._0_8_ = (double)auVar18._0_4_;
  auVar25._8_8_ = 0;
  auVar19._0_8_ = (double)fVar32;
  auVar19._8_8_ = 0;
  auVar18 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar19,auVar25);
  fVar29 = (float)auVar18._0_8_;
  fVar1 = (fVar28 - (float)(int)uVar12) + 0.5;
  local_3d4 = 0;
  local_3d8 = 0.0;
  local_3dc = 0;
  auVar18 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar32),
                            ZEXT416((uint)fVar28));
  auVar67._8_4_ = 0x80000000;
  auVar67._0_8_ = 0x8000000080000000;
  auVar67._12_4_ = 0x80000000;
  auVar23._8_4_ = 0x3effffff;
  auVar23._0_8_ = 0x3effffff3effffff;
  auVar23._12_4_ = 0x3effffff;
  auVar19 = vpternlogd_avx512vl(auVar23,auVar18,auVar67,0xf8);
  auVar18 = vroundss_avx(auVar18,ZEXT416((uint)(auVar18._0_4_ + auVar19._0_4_)),0xb);
  auVar45 = ZEXT1664(auVar18);
  if (0 < (int)((int)auVar18._0_4_ - uVar12)) {
    auVar18 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar32),
                              ZEXT416((uint)fVar29));
    auVar68._8_4_ = 0x80000000;
    auVar68._0_8_ = 0x8000000080000000;
    auVar68._12_4_ = 0x80000000;
    auVar46._8_4_ = 0x3effffff;
    auVar46._0_8_ = 0x3effffff3effffff;
    auVar46._12_4_ = 0x3effffff;
    auVar19 = vpternlogd_avx512vl(auVar46,auVar18,auVar68,0xf8);
    auVar18 = vroundss_avx(auVar18,ZEXT416((uint)(auVar18._0_4_ + auVar19._0_4_)),0xb);
    auVar45 = ZEXT1664(auVar18);
    if (0 < (int)((int)auVar18._0_4_ - uVar12)) {
      auVar18 = vfmadd213ss_fma(SUB6416(ZEXT464(0x41300000),0),ZEXT416((uint)fVar32),
                                ZEXT416((uint)fVar28));
      auVar69._8_4_ = 0x80000000;
      auVar69._0_8_ = 0x8000000080000000;
      auVar69._12_4_ = 0x80000000;
      auVar47._8_4_ = 0x3effffff;
      auVar47._0_8_ = 0x3effffff3effffff;
      auVar47._12_4_ = 0x3effffff;
      auVar19 = vpternlogd_avx512vl(auVar47,auVar18,auVar69,0xf8);
      auVar18 = vroundss_avx(auVar18,ZEXT416((uint)(auVar18._0_4_ + auVar19._0_4_)),0xb);
      auVar45 = ZEXT1664(auVar18);
      if ((int)((int)auVar18._0_4_ + uVar12) <= *in_RDI) {
        auVar18 = vfmadd213ss_fma(SUB6416(ZEXT464(0x41300000),0),ZEXT416((uint)fVar32),
                                  ZEXT416((uint)fVar29));
        auVar70._8_4_ = 0x80000000;
        auVar70._0_8_ = 0x8000000080000000;
        auVar70._12_4_ = 0x80000000;
        auVar48._8_4_ = 0x3effffff;
        auVar48._0_8_ = 0x3effffff3effffff;
        auVar48._12_4_ = 0x3effffff;
        auVar19 = vpternlogd_avx512vl(auVar48,auVar18,auVar70,0xf8);
        auVar18 = vroundss_avx(auVar18,ZEXT416((uint)(auVar18._0_4_ + auVar19._0_4_)),0xb);
        auVar45 = ZEXT1664(auVar18);
        if ((int)((int)auVar18._0_4_ + uVar12) <= in_RDI[1]) {
          for (local_400 = -0xc; local_400 < 0xc; local_400 = local_400 + 1) {
            auVar51._0_4_ = (float)local_400;
            auVar51._4_12_ = auVar45._4_12_;
            auVar18 = vfmadd213ss_fma(ZEXT416((uint)fVar32),auVar51,
                                      ZEXT416((uint)((fVar29 - (float)(int)uVar12) + 0.5)));
            uVar13 = (uint)auVar18._0_4_;
            auVar18 = vpinsrd_avx(ZEXT416(uVar13),uVar13,1);
            auVar18 = vpinsrd_avx(auVar18,uVar13,2);
            auVar21 = vpinsrd_avx(auVar18,uVar13,3);
            auVar18 = vpinsrd_avx(ZEXT416(uVar13),uVar13,1);
            auVar18 = vpinsrd_avx(auVar18,uVar13,2);
            auVar18 = vpinsrd_avx(auVar18,uVar13,3);
            uStack_70 = auVar18._0_8_;
            uStack_68 = auVar18._8_8_;
            local_280 = (float)kk0_inner_arrays_simd._0_8_;
            fStack_27c = SUB84(kk0_inner_arrays_simd._0_8_,4);
            fStack_278 = (float)kk0_inner_arrays_simd._8_8_;
            fStack_274 = SUB84(kk0_inner_arrays_simd._8_8_,4);
            fStack_270 = (float)kk0_inner_arrays_simd._16_8_;
            fStack_26c = SUB84(kk0_inner_arrays_simd._16_8_,4);
            fStack_268 = (float)kk0_inner_arrays_simd._24_8_;
            fStack_264 = SUB84(kk0_inner_arrays_simd._24_8_,4);
            local_2a0 = auVar20._0_4_;
            fStack_29c = auVar20._4_4_;
            fStack_298 = auVar20._8_4_;
            fStack_294 = auVar20._12_4_;
            fStack_290 = auVar17._0_4_;
            fStack_28c = auVar17._4_4_;
            fStack_288 = auVar17._8_4_;
            local_280 = local_280 * local_2a0;
            fStack_27c = fStack_27c * fStack_29c;
            fStack_278 = fStack_278 * fStack_298;
            fStack_274 = fStack_274 * fStack_294;
            fStack_270 = fStack_270 * fStack_290;
            fStack_26c = fStack_26c * fStack_28c;
            fStack_268 = fStack_268 * fStack_288;
            fStack_2b8 = (float)kk1_inner_arrays_simd._8_8_;
            fStack_2b4 = SUB84(kk1_inner_arrays_simd._8_8_,4);
            fStack_2b0 = (float)kk1_inner_arrays_simd._16_8_;
            fStack_2ac = SUB84(kk1_inner_arrays_simd._16_8_,4);
            fStack_2a8 = (float)kk1_inner_arrays_simd._24_8_;
            fStack_2a4 = SUB84(kk1_inner_arrays_simd._24_8_,4);
            fStack_2a8 = fStack_2a8 * fStack_288;
            auVar18 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
            auVar18 = vinsertps_avx(auVar18,ZEXT416((uint)fVar1),0x20);
            auVar18 = vinsertps_avx(auVar18,ZEXT416((uint)fVar1),0x30);
            auVar19 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
            auVar19 = vinsertps_avx(auVar19,ZEXT416((uint)fVar1),0x20);
            auVar19 = vinsertps_avx(auVar19,ZEXT416((uint)fVar1),0x30);
            uStack_e8 = auVar18._8_8_;
            uVar83 = auVar19._0_4_;
            uVar84 = auVar19._4_4_;
            uVar85 = auVar19._8_4_;
            uVar86 = auVar19._12_4_;
            uVar87 = auVar18._0_4_;
            uVar88 = auVar18._4_4_;
            uStack_148 = auVar18._8_4_;
            uStack_144 = auVar18._12_4_;
            haarY = (float *)CONCAT44(fStack_2b4 * fStack_294,fStack_2b8 * fStack_298);
            haarX = (float *)CONCAT44(fStack_2ac * fStack_28c,fStack_2b0 * fStack_290);
            row[0]._4_4_ = fStack_264;
            row[0]._0_4_ = fStack_268;
            row[1]._0_4_ = uVar83;
            row[1]._4_4_ = uVar84;
            row[2]._0_4_ = uVar85;
            row[2]._4_4_ = uVar86;
            row[3]._0_4_ = uVar87;
            row[3]._4_4_ = uVar88;
            col[1]._0_4_ = local_280;
            col[0] = uStack_e8;
            col[1]._4_4_ = fStack_27c;
            col[2]._0_4_ = fStack_278;
            col[2]._4_4_ = fStack_274;
            col[3]._0_4_ = fStack_270;
            col[3]._4_4_ = fStack_26c;
            scale_00[0]._4_4_ = fStack_2a4;
            scale_00[0]._0_4_ = fStack_2a8;
            scale_00[1]._0_4_ = uVar83;
            scale_00[1]._4_4_ = uVar84;
            scale_00[2]._0_4_ = uVar85;
            scale_00[2]._4_4_ = uVar86;
            scale_00[3]._0_4_ = uVar87;
            scale_00[3]._4_4_ = uVar88;
            uVar89 = uVar83;
            uVar90 = uVar84;
            uVar91 = uVar85;
            uVar92 = uVar86;
            uVar93 = uVar87;
            uVar94 = uVar88;
            haarXY_unconditional_vectorized(iimage_00,row,col,scale_00,haarX,haarY);
            row_00[0]._4_4_ = fStack_264;
            row_00[0]._0_4_ = fStack_268;
            row_00[1]._0_4_ = uVar89;
            row_00[1]._4_4_ = uVar90;
            row_00[2]._0_4_ = uVar91;
            row_00[2]._4_4_ = uVar92;
            row_00[3]._0_4_ = uVar93;
            row_00[3]._4_4_ = uVar94;
            col_00[0]._4_4_ = uStack_144;
            col_00[0]._0_4_ = uStack_148;
            col_00[1]._0_4_ = local_280;
            col_00[1]._4_4_ = fStack_27c;
            col_00[2]._0_4_ = fStack_278;
            col_00[2]._4_4_ = fStack_274;
            col_00[3]._0_4_ = fStack_270;
            col_00[3]._4_4_ = fStack_26c;
            scale_01[0]._4_4_ = fStack_2a4;
            scale_01[0]._0_4_ = fStack_2a8;
            scale_01[1]._0_4_ = uVar83;
            scale_01[1]._4_4_ = uVar84;
            scale_01[2]._0_4_ = uVar85;
            scale_01[2]._4_4_ = uVar86;
            scale_01[3]._0_4_ = uVar87;
            scale_01[3]._4_4_ = uVar88;
            haarXY_unconditional_vectorized(iimage_00,row_00,col_00,scale_01,haarX,haarY);
            auVar45 = ZEXT3264(CONCAT824(uStack_68,CONCAT816(uStack_70,auVar21)));
            row_01[0]._4_4_ = fStack_264;
            row_01[0]._0_4_ = fStack_268;
            row_01[1]._0_4_ = uVar89;
            row_01[1]._4_4_ = uVar90;
            row_01[2]._0_4_ = uVar91;
            row_01[2]._4_4_ = uVar92;
            row_01[3]._0_4_ = uVar93;
            row_01[3]._4_4_ = uVar94;
            col_01[0]._4_4_ = uStack_144;
            col_01[0]._0_4_ = uStack_148;
            col_01[1]._0_4_ = local_280;
            col_01[1]._4_4_ = fStack_27c;
            col_01[2]._0_4_ = fStack_278;
            col_01[2]._4_4_ = fStack_274;
            col_01[3]._0_4_ = fStack_270;
            col_01[3]._4_4_ = fStack_26c;
            scale_02[0]._4_4_ = fStack_2a4;
            scale_02[0]._0_4_ = fStack_2a8;
            scale_02[1]._0_4_ = uVar83;
            scale_02[1]._4_4_ = uVar84;
            scale_02[2]._0_4_ = uVar85;
            scale_02[2]._4_4_ = uVar86;
            scale_02[3]._0_4_ = uVar87;
            scale_02[3]._4_4_ = uVar88;
            haarXY_unconditional_vectorized(iimage_00,row_01,col_01,scale_02,haarX,haarY);
          }
          goto LAB_001aeb07;
        }
      }
    }
  }
  for (local_3e0 = -0xc; local_3e0 < 0xc; local_3e0 = local_3e0 + 1) {
    auVar49._0_4_ = (float)local_3e0;
    auVar49._4_12_ = auVar45._4_12_;
    auVar17 = vfmadd213ss_fma(ZEXT416((uint)fVar32),auVar49,
                              ZEXT416((uint)(fVar29 - (float)(int)uVar12)));
    local_628 = 0.5;
    if (auVar17._0_4_ < 0.0) {
      local_628 = -0.5;
    }
    auVar45 = ZEXT864((ulong)((double)auVar17._0_4_ + local_628));
    for (local_3f0 = -0xc; local_3f0 < 0xc; local_3f0 = local_3f0 + 1) {
      auVar50._0_4_ = (float)local_3f0;
      auVar50._4_12_ = auVar45._4_12_;
      auVar17 = vfmadd213ss_fma(ZEXT416((uint)fVar32),auVar50,
                                ZEXT416((uint)(fVar28 - (float)(int)uVar12)));
      local_640 = 0.5;
      if (auVar17._0_4_ < 0.0) {
        local_640 = -0.5;
      }
      auVar45 = ZEXT864((ulong)((double)auVar17._0_4_ + local_640));
      haarXY_precheck_boundaries
                ((integral_image *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                 in_stack_fffffffffffffa14,in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                 (float *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                 (float *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
    }
  }
LAB_001aeb07:
  auVar33._4_12_ = SUB1612(ZEXT816(0x3fe0000000000000),4);
  auVar33._0_4_ = fVar32 * 0.5;
  auVar71._8_4_ = 0x80000000;
  auVar71._0_8_ = 0x8000000080000000;
  auVar71._12_4_ = 0x80000000;
  auVar52._8_4_ = 0x3effffff;
  auVar52._0_8_ = 0x3effffff3effffff;
  auVar52._12_4_ = 0x3effffff;
  auVar17 = vpternlogd_avx512vl(auVar52,auVar33,auVar71,0xf8);
  auVar17 = vroundss_avx(auVar33,ZEXT416((uint)(fVar32 * 0.5 + auVar17._0_4_)),0xb);
  auVar34._4_12_ = SUB1612(ZEXT816(0x3ff8000000000000),4);
  auVar34._0_4_ = fVar32 * 1.5;
  auVar72._8_4_ = 0x80000000;
  auVar72._0_8_ = 0x8000000080000000;
  auVar72._12_4_ = 0x80000000;
  auVar53._8_4_ = 0x3effffff;
  auVar53._0_8_ = 0x3effffff3effffff;
  auVar53._12_4_ = 0x3effffff;
  auVar20 = vpternlogd_avx512vl(auVar53,auVar34,auVar72,0xf8);
  auVar20 = vroundss_avx(auVar34,ZEXT416((uint)(fVar32 * 1.5 + auVar20._0_4_)),0xb);
  auVar35._4_12_ = SUB1612(ZEXT816(0x4004000000000000),4);
  auVar35._0_4_ = fVar32 * 2.5;
  auVar73._8_4_ = 0x80000000;
  auVar73._0_8_ = 0x8000000080000000;
  auVar73._12_4_ = 0x80000000;
  auVar54._8_4_ = 0x3effffff;
  auVar54._0_8_ = 0x3effffff3effffff;
  auVar54._12_4_ = 0x3effffff;
  auVar18 = vpternlogd_avx512vl(auVar54,auVar35,auVar73,0xf8);
  auVar18 = vroundss_avx(auVar35,ZEXT416((uint)(fVar32 * 2.5 + auVar18._0_4_)),0xb);
  fVar30 = auVar18._0_4_;
  auVar36._4_12_ = SUB1612(ZEXT816(0x400c000000000000),4);
  auVar36._0_4_ = fVar32 * 3.5;
  auVar74._8_4_ = 0x80000000;
  auVar74._0_8_ = 0x8000000080000000;
  auVar74._12_4_ = 0x80000000;
  auVar55._8_4_ = 0x3effffff;
  auVar55._0_8_ = 0x3effffff3effffff;
  auVar55._12_4_ = 0x3effffff;
  auVar18 = vpternlogd_avx512vl(auVar55,auVar36,auVar74,0xf8);
  auVar18 = vroundss_avx(auVar36,ZEXT416((uint)(fVar32 * 3.5 + auVar18._0_4_)),0xb);
  auVar37._4_12_ = SUB1612(ZEXT816(0x4012000000000000),4);
  auVar37._0_4_ = fVar32 * 4.5;
  auVar75._8_4_ = 0x80000000;
  auVar75._0_8_ = 0x8000000080000000;
  auVar75._12_4_ = 0x80000000;
  auVar56._8_4_ = 0x3effffff;
  auVar56._0_8_ = 0x3effffff3effffff;
  auVar56._12_4_ = 0x3effffff;
  auVar19 = vpternlogd_avx512vl(auVar56,auVar37,auVar75,0xf8);
  auVar19 = vroundss_avx(auVar37,ZEXT416((uint)(fVar32 * 4.5 + auVar19._0_4_)),0xb);
  auVar38._4_12_ = SUB1612(ZEXT816(0x4016000000000000),4);
  auVar38._0_4_ = fVar32 * 5.5;
  auVar76._8_4_ = 0x80000000;
  auVar76._0_8_ = 0x8000000080000000;
  auVar76._12_4_ = 0x80000000;
  auVar57._8_4_ = 0x3effffff;
  auVar57._0_8_ = 0x3effffff3effffff;
  auVar57._12_4_ = 0x3effffff;
  auVar21 = vpternlogd_avx512vl(auVar57,auVar38,auVar76,0xf8);
  auVar21 = vroundss_avx(auVar38,ZEXT416((uint)(fVar32 * 5.5 + auVar21._0_4_)),0xb);
  auVar39._4_12_ = SUB1612(ZEXT816(0x401a000000000000),4);
  auVar39._0_4_ = fVar32 * 6.5;
  auVar77._8_4_ = 0x80000000;
  auVar77._0_8_ = 0x8000000080000000;
  auVar77._12_4_ = 0x80000000;
  auVar58._8_4_ = 0x3effffff;
  auVar58._0_8_ = 0x3effffff3effffff;
  auVar58._12_4_ = 0x3effffff;
  auVar22 = vpternlogd_avx512vl(auVar58,auVar39,auVar77,0xf8);
  auVar22 = vroundss_avx(auVar39,ZEXT416((uint)(fVar32 * 6.5 + auVar22._0_4_)),0xb);
  auVar40._4_12_ = SUB1612(ZEXT816(0x401e000000000000),4);
  auVar40._0_4_ = fVar32 * 7.5;
  auVar78._8_4_ = 0x80000000;
  auVar78._0_8_ = 0x8000000080000000;
  auVar78._12_4_ = 0x80000000;
  auVar59._8_4_ = 0x3effffff;
  auVar59._0_8_ = 0x3effffff3effffff;
  auVar59._12_4_ = 0x3effffff;
  auVar23 = vpternlogd_avx512vl(auVar59,auVar40,auVar78,0xf8);
  auVar23 = vroundss_avx(auVar40,ZEXT416((uint)(fVar32 * 7.5 + auVar23._0_4_)),0xb);
  fVar31 = auVar23._0_4_;
  auVar41._4_12_ = SUB1612(ZEXT816(0x4021000000000000),4);
  auVar41._0_4_ = fVar32 * 8.5;
  auVar79._8_4_ = 0x80000000;
  auVar79._0_8_ = 0x8000000080000000;
  auVar79._12_4_ = 0x80000000;
  auVar60._8_4_ = 0x3effffff;
  auVar60._0_8_ = 0x3effffff3effffff;
  auVar60._12_4_ = 0x3effffff;
  auVar23 = vpternlogd_avx512vl(auVar60,auVar41,auVar79,0xf8);
  auVar23 = vroundss_avx(auVar41,ZEXT416((uint)(fVar32 * 8.5 + auVar23._0_4_)),0xb);
  auVar42._4_12_ = SUB1612(ZEXT816(0x4023000000000000),4);
  auVar42._0_4_ = fVar32 * 9.5;
  auVar80._8_4_ = 0x80000000;
  auVar80._0_8_ = 0x8000000080000000;
  auVar80._12_4_ = 0x80000000;
  auVar61._8_4_ = 0x3effffff;
  auVar61._0_8_ = 0x3effffff3effffff;
  auVar61._12_4_ = 0x3effffff;
  auVar24 = vpternlogd_avx512vl(auVar61,auVar42,auVar80,0xf8);
  auVar24 = vroundss_avx(auVar42,ZEXT416((uint)(fVar32 * 9.5 + auVar24._0_4_)),0xb);
  auVar43._4_12_ = SUB1612(ZEXT816(0x4025000000000000),4);
  auVar43._0_4_ = fVar32 * 10.5;
  auVar81._8_4_ = 0x80000000;
  auVar81._0_8_ = 0x8000000080000000;
  auVar81._12_4_ = 0x80000000;
  auVar62._8_4_ = 0x3effffff;
  auVar62._0_8_ = 0x3effffff3effffff;
  auVar62._12_4_ = 0x3effffff;
  auVar25 = vpternlogd_avx512vl(auVar62,auVar43,auVar81,0xf8);
  auVar25 = vroundss_avx(auVar43,ZEXT416((uint)(fVar32 * 10.5 + auVar25._0_4_)),0xb);
  auVar44._4_12_ = SUB1612(ZEXT816(0x4027000000000000),4);
  auVar44._0_4_ = fVar32 * 11.5;
  auVar82._8_4_ = 0x80000000;
  auVar82._0_8_ = 0x8000000080000000;
  auVar82._12_4_ = 0x80000000;
  auVar63._8_4_ = 0x3effffff;
  auVar63._0_8_ = 0x3effffff3effffff;
  auVar63._12_4_ = 0x3effffff;
  auVar26 = vpternlogd_avx512vl(auVar63,auVar44,auVar82,0xf8);
  auVar26 = vroundss_avx(auVar44,ZEXT416((uint)(fVar32 * 11.5 + auVar26._0_4_)),0xb);
  fVar32 = fVar30 + auVar20._0_4_;
  fVar1 = fVar30 + auVar17._0_4_;
  fVar28 = fVar30 - auVar17._0_4_;
  fVar29 = fVar30 - auVar20._0_4_;
  fVar2 = fVar30 - auVar18._0_4_;
  fVar3 = fVar30 - auVar19._0_4_;
  fVar4 = fVar30 - auVar21._0_4_;
  fVar30 = fVar30 - auVar22._0_4_;
  fVar5 = fVar31 - auVar18._0_4_;
  fVar6 = fVar31 - auVar19._0_4_;
  fVar7 = fVar31 - auVar21._0_4_;
  fVar8 = fVar31 - auVar22._0_4_;
  fVar9 = fVar31 - auVar23._0_4_;
  fVar10 = fVar31 - auVar24._0_4_;
  fVar11 = fVar31 - auVar25._0_4_;
  fVar31 = fVar31 - auVar26._0_4_;
  gauss_s1_c0[0] = expf(fVar27 * fVar32 * fVar32);
  gauss_s1_c0[1] = expf(fVar27 * fVar1 * fVar1);
  gauss_s1_c0[2] = expf(fVar27 * fVar28 * fVar28);
  gauss_s1_c0[3] = expf(fVar27 * fVar29 * fVar29);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar27 * fVar2 * fVar2);
  gauss_s1_c0[6] = expf(fVar27 * fVar3 * fVar3);
  gauss_s1_c0[7] = expf(fVar27 * fVar4 * fVar4);
  gauss_s1_c0[8] = expf(fVar27 * fVar30 * fVar30);
  gauss_s1_c1[0] = expf(fVar27 * fVar5 * fVar5);
  gauss_s1_c1[1] = expf(fVar27 * fVar6 * fVar6);
  gauss_s1_c1[2] = expf(fVar27 * fVar7 * fVar7);
  gauss_s1_c1[3] = expf(fVar27 * fVar8 * fVar8);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar27 * fVar9 * fVar9);
  gauss_s1_c1[6] = expf(fVar27 * fVar10 * fVar10);
  gauss_s1_c1[7] = expf(fVar27 * fVar11 * fVar11);
  gauss_s1_c1[8] = expf(fVar27 * fVar31 * fVar31);
  for (local_594 = -8; local_594 < 8; local_594 = local_594 + 5) {
    if ((local_594 == -8) || (local_594 == 7)) {
      local_5a0 = gauss_s1_c1;
    }
    else {
      local_5a0 = gauss_s1_c0;
    }
    iVar14 = 0;
    if (local_594 < 0) {
      iVar14 = 8;
    }
    iVar15 = 1;
    if (local_594 < 0) {
      iVar15 = -1;
    }
    for (local_5ac = -8; local_5ac < 8; local_5ac = local_5ac + 5) {
      if ((local_5ac == -8) || (local_5ac == 7)) {
        local_5b8 = gauss_s1_c1;
      }
      else {
        local_5b8 = gauss_s1_c0;
      }
      local_5bc = 0.0;
      local_5c0 = 0.0;
      local_5c4 = 0.0;
      local_5c8 = 0.0;
      local_5cc = 0;
      if (local_5ac < 0) {
        local_5cc = 8;
      }
      iVar16 = 1;
      if (local_5ac < 0) {
        iVar16 = -1;
      }
      for (local_5d4 = (local_5ac + 8) * 0x18;
          SBORROW4(local_5d4,(local_5ac + 0x11) * 0x18) !=
          local_5d4 + (local_5ac + 0x11) * -0x18 < 0; local_5d4 = local_5d4 + 0x18) {
        local_5dc = iVar14;
        for (local_5e0 = local_594 + 8; local_5e0 < local_594 + 0x11; local_5e0 = local_5e0 + 1) {
          fVar32 = local_5a0[local_5dc] * local_5b8[local_5cc] *
                   haarResponseY[local_5d4 + local_5e0];
          fVar1 = local_5a0[local_5dc] * local_5b8[local_5cc] * haarResponseX[local_5d4 + local_5e0]
          ;
          local_5bc = fVar32 + local_5bc;
          local_5c0 = fVar1 + local_5c0;
          auVar64._8_4_ = 0x7fffffff;
          auVar64._0_8_ = 0x7fffffff7fffffff;
          auVar64._12_4_ = 0x7fffffff;
          auVar17 = vpand_avx(ZEXT416((uint)fVar32),auVar64);
          local_5c4 = auVar17._0_4_ + local_5c4;
          auVar65._8_4_ = 0x7fffffff;
          auVar65._0_8_ = 0x7fffffff7fffffff;
          auVar65._12_4_ = 0x7fffffff;
          auVar17 = vpand_avx(ZEXT416((uint)fVar1),auVar65);
          local_5c8 = auVar17._0_4_ + local_5c8;
          local_5dc = iVar15 + local_5dc;
        }
        local_5cc = iVar16 + local_5cc;
      }
      fVar32 = gauss_s2_arr[local_3dc];
      local_3dc = local_3dc + 1;
      local_5bc = local_5bc * fVar32;
      local_5c0 = local_5c0 * fVar32;
      local_5c4 = local_5c4 * fVar32;
      local_5c8 = local_5c8 * fVar32;
      in_RSI[(long)local_3d4 + 5] = local_5bc;
      in_RSI[(long)(local_3d4 + 1) + 5] = local_5c0;
      in_RSI[(long)(local_3d4 + 2) + 5] = local_5c4;
      in_RSI[(long)(local_3d4 + 3) + 5] = local_5c8;
      auVar17 = vfmadd213ss_fma(ZEXT416((uint)local_5bc),ZEXT416((uint)local_5bc),
                                ZEXT416((uint)(local_5c0 * local_5c0)));
      auVar17 = vfmadd213ss_fma(ZEXT416((uint)local_5c4),ZEXT416((uint)local_5c4),auVar17);
      auVar17 = vfmadd213ss_fma(ZEXT416((uint)local_5c8),ZEXT416((uint)local_5c8),auVar17);
      local_3d8 = auVar17._0_4_ + local_3d8;
      local_3d4 = local_3d4 + 4;
    }
  }
  fVar32 = sqrtf(local_3d8);
  for (local_614 = 0; local_614 < 0x40; local_614 = local_614 + 1) {
    in_RSI[(long)local_614 + 5] = (1.0 / fVar32) * in_RSI[(long)local_614 + 5];
  }
  return;
}

Assistant:

void get_msurf_descriptor_simd(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    // float scale_mul_25f = 2.5f*scale;
    int int_scale = (int) roundf(scale);

    __m256i int_scale_vec = _mm256_set1_epi32(int_scale);
    __m256 scale_vec = _mm256_set1_ps(scale);

    // int int_scale_mul_2 =  2 * int_scale;
    float scale_squared = scale*scale;

    float g1_factor = -0.08f / (scale_squared); // since 0.08f / (scale*scale) == 1.0f / (2.0f * 2.5f * scale * 2.5f * scale)
    //float g2_factor = -1.0f / 4.5f; // since 1.0f / 4.5f == 1.0f / (2.0f * 1.5f * 1.5f)

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    //r(2.5*s) + r(1.5*s) == -(r(2.5*s) - r(6.5*s))

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    { // some outside
        for (int l=-12, l_count=0; l<12; ++l, ++l_count) {
            float ipoint_y_sub_int_scale_add_l_mul_scale = ipoint_y_sub_int_scale + l * scale;
            int sample_y_sub_int_scale = (int) (ipoint_y_sub_int_scale_add_l_mul_scale + (ipoint_y_sub_int_scale_add_l_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; ++k, k_count++) {

                //Get x coords of sample point
                float ipoint_x_sub_int_scale_add_k_mul_scale = ipoint_x_sub_int_scale + k * scale;
                int sample_x_sub_int_scale = (int) (ipoint_x_sub_int_scale_add_k_mul_scale + (ipoint_x_sub_int_scale_add_k_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &haarResponseX[l_count*24+k_count], &haarResponseY[l_count*24+k_count]);
            }

        }

    } else {

        for (int l=-12, l_count=0; l<12; ++l, ++l_count) {
            int sample_y_sub_int_scale = (int)(ipoint_y_sub_int_scale_add_05 + l * scale);

            __m256i sample_y_sub_int_scale_vec = _mm256_set1_epi32(sample_y_sub_int_scale);

            __m256 kks0 = _mm256_mul_ps(kk0_inner_arrays_simd, scale_vec);
            __m256 kks1 = _mm256_mul_ps(kk1_inner_arrays_simd, scale_vec);
            __m256 kks2 = _mm256_mul_ps(kk2_inner_arrays_simd, scale_vec);

            __m256 ipoint_x_sub_int_scale_add_05_vec = _mm256_set1_ps(ipoint_x_sub_int_scale_add_05);

            // USE CVTTPS_EPI32 FOR TRUNCATION!!!
            __m256i sample_col0 = _mm256_cvttps_epi32(_mm256_add_ps(ipoint_x_sub_int_scale_add_05_vec, kks0));
            __m256i sample_col1 = _mm256_cvttps_epi32(_mm256_add_ps(ipoint_x_sub_int_scale_add_05_vec, kks1));
            __m256i sample_col2 = _mm256_cvttps_epi32(_mm256_add_ps(ipoint_x_sub_int_scale_add_05_vec, kks2));
            
            haarXY_unconditional_vectorized(iimage, sample_y_sub_int_scale_vec, sample_col0, int_scale_vec, 
                                            &haarResponseX[l_count*24+0], &haarResponseY[l_count*24+0]);
            
            haarXY_unconditional_vectorized(iimage, sample_y_sub_int_scale_vec, sample_col1, int_scale_vec, 
                                            &haarResponseX[l_count*24+8], &haarResponseY[l_count*24+8]);
            
            haarXY_unconditional_vectorized(iimage, sample_y_sub_int_scale_vec, sample_col2, int_scale_vec, 
                                            &haarResponseX[l_count*24+16], &haarResponseY[l_count*24+16]);

        }
        
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));
    
    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}